

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_80(QPDF *pdf,char *arg2)

{
  undefined8 *puVar1;
  QPDFPageObjectHelper QVar2;
  pointer pQVar3;
  long *plVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle *annot;
  pointer pQVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDF pdf2;
  QPDFWriter w2;
  value_type page1;
  value_type page2;
  QPDFObjectHandle old_annots;
  QPDFWriter w1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  QPDFAcroFormDocumentHelper afdh;
  QPDFMatrix m;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 in_stack_fffffffffffffe08 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffe18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffe20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  undefined1 local_1c0 [16];
  element_type *local_1b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a8;
  _func_int **local_1a0;
  element_type *peStack_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  QPDFObjectHandle local_188;
  undefined8 local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  undefined1 local_168 [32];
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_138;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_118;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_100;
  QPDFAcroFormDocumentHelper local_e8;
  QPDFAcroFormDocumentHelper local_c8;
  undefined8 local_a8;
  element_type *peStack_a0;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_90;
  QPDFPageObjectHelper local_60;
  
  QPDFMatrix::QPDFMatrix((QPDFMatrix *)&local_c8);
  QPDFMatrix::translate(306.0,396.0);
  QPDFMatrix::scale(0.4,0.4);
  plVar4 = (long *)QPDF::getAllPages();
  puVar1 = (undefined8 *)*plVar4;
  if ((undefined8 *)plVar4[1] == puVar1) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    uVar5 = *puVar1;
    local_1c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
      }
    }
    local_1c0._0_8_ = &local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/Annots","");
    QPDFObjectHandle::getKey((string *)&local_188);
    if ((element_type **)local_1c0._0_8_ != &local_1b0) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0 + 1));
    }
    local_138.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&local_e8,pdf);
    local_148 = local_188.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_140 = local_188.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_188.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_188.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_188.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_188.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_188.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    uVar9 = 0;
    uVar10 = 0;
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_148;
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_e8;
    QPDFAcroFormDocumentHelper::transformAnnotations
              (QVar7,(vector *)&local_138,(vector *)&local_118,(set *)&local_90,
               (QPDFMatrix *)&local_c8,(QPDF *)0x0,(QPDFAcroFormDocumentHelper *)0x0);
    if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
    }
    pQVar3 = local_138.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_138.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_138.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pQVar6 = local_138.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        QPDFObjectHandle::appendItem(&local_188);
        pQVar6 = pQVar6 + 1;
      } while (pQVar6 != pQVar3);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_100,&local_118);
    QPDFAcroFormDocumentHelper::addAndRenameFormFields(&local_e8,&local_100);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_100);
    QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1c0);
    local_a8 = local_1a0;
    peStack_a0 = peStack_198;
    local_c8.m.super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_1b0;
    local_c8.m.super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Stack_1a8;
    local_c8._0_8_ = local_1c0._0_8_;
    local_c8._8_8_ = local_1c0._8_8_;
    QPDFMatrix::translate(612.0,0.0);
    QPDFMatrix::scale(-1.0,1.0);
    QPDF::QPDF((QPDF *)&stack0xfffffffffffffe10);
    QPDF::processFile(&stack0xfffffffffffffe10,arg2);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)local_168,(QPDF *)&stack0xfffffffffffffe10);
    QPDFPageDocumentHelper::getAllPages();
    if (in_stack_fffffffffffffe20 != in_stack_fffffffffffffe18) {
      local_1c0._8_4_ = in_stack_fffffffffffffe18->_M_use_count;
      local_1c0._12_4_ = in_stack_fffffffffffffe18->_M_weak_count;
      local_1b0 = (element_type *)in_stack_fffffffffffffe18[1]._vptr__Sp_counted_base;
      if (local_1b0 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_1b0 + 8) = *(int *)(local_1b0 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_1b0 + 8) = *(int *)(local_1b0 + 8) + 1;
        }
      }
      p_Stack_1a8._0_4_ = in_stack_fffffffffffffe18[1]._M_use_count;
      p_Stack_1a8._4_4_ = in_stack_fffffffffffffe18[1]._M_weak_count;
      local_1a0 = in_stack_fffffffffffffe18[2]._vptr__Sp_counted_base;
      if (local_1a0 != (_func_int **)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_1a0 + 1) = *(int *)(local_1a0 + 1) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_1a0 + 1) = *(int *)(local_1a0 + 1) + 1;
        }
      }
      local_1c0._0_8_ = &PTR__QPDFPageObjectHelper_001589e8;
      peStack_198 = *(element_type **)&in_stack_fffffffffffffe18[2]._M_use_count;
      local_190._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           in_stack_fffffffffffffe18[3]._vptr__Sp_counted_base;
      if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                 &stack0xfffffffffffffe18);
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_168);
      if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
        }
      }
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_178;
      local_178 = uVar5;
      local_170 = local_1c8;
      QPDFPageObjectHelper::QPDFPageObjectHelper(&local_60,QVar8);
      QVar2._8_8_ = uVar10;
      QVar2._0_8_ = uVar9;
      QVar2._16_16_ = in_stack_fffffffffffffe08;
      QVar2._32_8_ = in_stack_fffffffffffffe18;
      QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)in_stack_fffffffffffffe20;
      QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = in_stack_fffffffffffffe28._M_pi;
      QPDFPageObjectHelper::copyAnnotations
                (QVar2,(QPDFMatrix *)local_1c0,(QPDFAcroFormDocumentHelper *)&local_60,&local_c8);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_60);
      if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
      }
      QPDFWriter::QPDFWriter((QPDFWriter *)local_168,pdf,"a.pdf");
      QPDFWriter::setStaticID(SUB81(local_168,0));
      QPDFWriter::setQDFMode(SUB81(local_168,0));
      QPDFWriter::write();
      QPDFWriter::QPDFWriter
                ((QPDFWriter *)&stack0xfffffffffffffe18,(QPDF *)&stack0xfffffffffffffe10,"b.pdf");
      QPDFWriter::setStaticID(SUB81(&stack0xfffffffffffffe18,0));
      QPDFWriter::setQDFMode(SUB81(&stack0xfffffffffffffe18,0));
      QPDFWriter::write();
      if (in_stack_fffffffffffffe20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffe20);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
      }
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_1c0);
      QPDF::~QPDF((QPDF *)&stack0xfffffffffffffe10);
      QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_e8);
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&local_90);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_118);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_138);
      if (local_188.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
      }
      return;
    }
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_1c0);
  QPDF::~QPDF((QPDF *)&stack0xfffffffffffffe10);
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_e8);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_90);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_118);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_138);
  if (local_188.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

static void
test_80(QPDF& pdf, char const* arg2)
{
    // Exercise transform/copy annotations without passing in
    // QPDFAcroFormDocumentHelper pointers. The case of passing
    // them in is sufficiently exercised by testing through the
    // qpdf CLI.

    // The main file is a file that has lots of annotations. Arg2
    // is a file to copy annotations to.

    QPDFMatrix m;
    m.translate(306, 396);
    m.scale(0.4, 0.4);
    auto page1 = pdf.getAllPages().at(0);
    auto old_annots = page1.getKey("/Annots");
    // Transform annotations and copy them back to the same page.
    std::vector<QPDFObjectHandle> new_annots;
    std::vector<QPDFObjectHandle> new_fields;
    std::set<QPDFObjGen> old_fields;
    QPDFAcroFormDocumentHelper afdh(pdf);
    // Use defaults for from_qpdf and from_afdh.
    afdh.transformAnnotations(old_annots, new_annots, new_fields, old_fields, m);
    for (auto const& annot: new_annots) {
        old_annots.appendItem(annot);
    }
    afdh.addAndRenameFormFields(new_fields);

    m = QPDFMatrix();
    m.translate(612, 0);
    m.scale(-1, 1);
    QPDF pdf2;
    pdf2.processFile(arg2);
    auto page2 = QPDFPageDocumentHelper(pdf2).getAllPages().at(0);
    page2.copyAnnotations(page1, m);

    QPDFWriter w1(pdf, "a.pdf");
    w1.setStaticID(true);
    w1.setQDFMode(true);
    w1.write();

    QPDFWriter w2(pdf2, "b.pdf");
    w2.setStaticID(true);
    w2.setQDFMode(true);
    w2.write();
}